

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferTests.cpp
# Opt level: O0

SparseContext * __thiscall
vkt::api::anon_unknown_0::BufferTestInstance::createSparseContext(BufferTestInstance *this)

{
  VkPhysicalDeviceFeatures *__return_storage_ptr__;
  InstanceInterface *vk_00;
  VkPhysicalDevice physicalDevice_00;
  undefined1 local_198 [8];
  Move<vk::VkDevice_s_*> device;
  undefined1 local_178 [4];
  float queuePriority;
  VkDeviceCreateInfo deviceInfo;
  VkDeviceQueueCreateInfo queueInfo;
  deUint32 queueIndex;
  VkPhysicalDeviceFeatures deviceFeatures;
  VkPhysicalDevice physicalDevice;
  InstanceInterface *vk;
  BufferTestInstance *this_local;
  
  if (((((this->m_testCase).flags & 1) == 0) && (((this->m_testCase).flags & 2) == 0)) &&
     (((this->m_testCase).flags & 4) == 0)) {
    this_local = (BufferTestInstance *)0x0;
  }
  else {
    vk_00 = getInstanceInterface(this);
    physicalDevice_00 = getPhysicalDevice(this);
    __return_storage_ptr__ = (VkPhysicalDeviceFeatures *)((long)&queueInfo.pQueuePriorities + 4);
    ::vk::getPhysicalDeviceFeatures(__return_storage_ptr__,vk_00,physicalDevice_00);
    queueInfo.pQueuePriorities._0_4_ = findQueueFamilyIndexWithCaps(vk_00,physicalDevice_00,9);
    device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator._4_4_ = 0x3f800000;
    ::deMemset(&deviceInfo.pEnabledFeatures,0,0x28);
    ::deMemset((VkDeviceCreateInfo *)local_178,0,0x48);
    deviceInfo.pEnabledFeatures._0_4_ = 2;
    queueInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    queueInfo._4_4_ = 0;
    queueInfo.pNext._0_4_ = 0;
    queueInfo.pNext._4_4_ = (deUint32)queueInfo.pQueuePriorities;
    queueInfo.flags = 1;
    queueInfo._24_8_ = (long)&device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator + 4;
    local_178 = (undefined1  [4])0x3;
    deviceInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    deviceInfo._4_4_ = 0;
    deviceInfo.pNext._4_4_ = 1;
    deviceInfo.ppEnabledLayerNames._0_4_ = 0;
    deviceInfo.enabledExtensionCount = 0;
    deviceInfo._52_4_ = 0;
    deviceInfo.pQueueCreateInfos._0_4_ = 0;
    deviceInfo.enabledLayerCount = 0;
    deviceInfo._36_4_ = 0;
    deviceInfo._16_8_ = &deviceInfo.pEnabledFeatures;
    deviceInfo.ppEnabledExtensionNames = (char **)__return_storage_ptr__;
    ::vk::createDevice((Move<vk::VkDevice_s_*> *)local_198,vk_00,physicalDevice_00,
                       (VkDeviceCreateInfo *)local_178,(VkAllocationCallbacks *)0x0);
    this_local = (BufferTestInstance *)operator_new(0x4d8);
    SparseContext::SparseContext
              ((SparseContext *)this_local,(Move<vk::VkDevice_s_*> *)local_198,
               (deUint32)queueInfo.pQueuePriorities,vk_00);
    ::vk::refdetails::Move<vk::VkDevice_s_*>::~Move((Move<vk::VkDevice_s_*> *)local_198);
  }
  return (SparseContext *)this_local;
}

Assistant:

SparseContext*					createSparseContext	(void) const
	{
		if ((m_testCase.flags & VK_BUFFER_CREATE_SPARSE_BINDING_BIT) ||
			(m_testCase.flags & VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT) ||
			(m_testCase.flags & VK_BUFFER_CREATE_SPARSE_ALIASED_BIT))
		{
			const InstanceInterface&		vk				= getInstanceInterface();
			const VkPhysicalDevice			physicalDevice	= getPhysicalDevice();
			const VkPhysicalDeviceFeatures	deviceFeatures	= getPhysicalDeviceFeatures(vk, physicalDevice);

			const deUint32 queueIndex = findQueueFamilyIndexWithCaps(vk, physicalDevice, VK_QUEUE_GRAPHICS_BIT|VK_QUEUE_SPARSE_BINDING_BIT);

			VkDeviceQueueCreateInfo			queueInfo;
			VkDeviceCreateInfo				deviceInfo;
			const float						queuePriority	= 1.0f;

			deMemset(&queueInfo,	0, sizeof(queueInfo));
			deMemset(&deviceInfo,	0, sizeof(deviceInfo));

			queueInfo.sType							= VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
			queueInfo.pNext							= DE_NULL;
			queueInfo.flags							= (VkDeviceQueueCreateFlags)0u;
			queueInfo.queueFamilyIndex				= queueIndex;
			queueInfo.queueCount					= 1u;
			queueInfo.pQueuePriorities				= &queuePriority;

			deviceInfo.sType						= VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
			deviceInfo.pNext						= DE_NULL;
			deviceInfo.queueCreateInfoCount			= 1u;
			deviceInfo.pQueueCreateInfos			= &queueInfo;
			deviceInfo.enabledExtensionCount		= 0u;
			deviceInfo.ppEnabledExtensionNames		= DE_NULL;
			deviceInfo.enabledLayerCount			= 0u;
			deviceInfo.ppEnabledLayerNames			= DE_NULL;
			deviceInfo.pEnabledFeatures				= &deviceFeatures;

			Move<VkDevice>	device = createDevice(vk, physicalDevice, &deviceInfo);

			return new SparseContext(device, queueIndex, vk);
		}

		return DE_NULL;
	}